

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O3

_Bool intersect_box3_sphere(box3_t b,vec3_t c,float r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = c.z;
  fVar1 = c.x;
  if (b.min.x <= fVar1) {
    fVar3 = 0.0;
    b.min.x = b.max.x;
    if (fVar1 <= b.max.x) goto LAB_00105104;
  }
  fVar3 = (fVar1 - b.min.x) * (fVar1 - b.min.x);
LAB_00105104:
  fVar1 = c.y;
  if ((fVar1 < b.min.y) || (b.min.y = b.max.y, b.max.y < fVar1)) {
    fVar3 = fVar3 + (fVar1 - b.min.y) * (fVar1 - b.min.y);
  }
  if ((fVar2 < b.min.z) || (b.min.z = b.max.z, b.max.z < fVar2)) {
    fVar3 = fVar3 + (fVar2 - b.min.z) * (fVar2 - b.min.z);
  }
  return fVar3 < r * r;
}

Assistant:

bool
intersect_box3_sphere(box3_t b, vec3_t c, float r) {
    float dist = 0.0f;

    if (c.x < b.min.x) { dist += sqrf(c.x - b.min.x); }
    else if (c.x > b.max.x) { dist += sqrf(c.x - b.max.x); }

    if (c.y < b.min.y) { dist += sqrf(c.y - b.min.y); }
    else if (c.y > b.max.y) { dist += sqrf(c.y - b.max.y); }

    if (c.z < b.min.z) { dist += sqrf(c.z - b.min.z); }
    else if (c.z > b.max.z) { dist += sqrf(c.z - b.max.z); }

    return r * r > dist;
}